

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDebugLoc::LocationList::dump
          (LocationList *this,raw_ostream *OS,uint64_t BaseAddress,bool IsLittleEndian,
          uint AddressSize,MCRegisterInfo *MRI,DWARFUnit *U,DIDumpOptions DumpOpts,uint Indent)

{
  uint64_t uVar1;
  ArrayRef<unsigned_char> local_c0;
  long local_b0;
  uint local_a8;
  int local_a4;
  format_object<unsigned_int,_unsigned_int,_unsigned_long> local_a0;
  long local_80;
  uint local_78;
  int local_74;
  format_object<unsigned_int,_unsigned_int,_unsigned_long> local_70;
  const_iterator local_50;
  Entry *E;
  const_iterator __end1;
  const_iterator __begin1;
  SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *__range1;
  MCRegisterInfo *MRI_local;
  uint AddressSize_local;
  bool IsLittleEndian_local;
  uint64_t BaseAddress_local;
  raw_ostream *OS_local;
  LocationList *this_local;
  
  __begin1 = (const_iterator)&this->Entries;
  __range1 = (SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *)MRI;
  MRI_local._0_4_ = AddressSize;
  MRI_local._7_1_ = IsLittleEndian;
  _AddressSize_local = BaseAddress;
  BaseAddress_local = (uint64_t)OS;
  OS_local = (raw_ostream *)this;
  __end1 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                     ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)__begin1);
  E = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::end
                ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)__begin1);
  for (; __end1 != E; __end1 = __end1 + 1) {
    local_50 = __end1;
    raw_ostream::operator<<((raw_ostream *)BaseAddress_local,'\n');
    raw_ostream::indent((raw_ostream *)BaseAddress_local,Indent);
    uVar1 = BaseAddress_local;
    local_74 = (uint)MRI_local << 1;
    local_78 = (uint)MRI_local << 1;
    local_80 = _AddressSize_local + local_50->Begin;
    format<unsigned_int,unsigned_int,unsigned_long>
              (&local_70,(llvm *)"[0x%*.*lx, ",(char *)&local_74,&local_78,(uint *)&local_80,
               (unsigned_long *)MRI);
    raw_ostream::operator<<((raw_ostream *)uVar1,&local_70.super_format_object_base);
    uVar1 = BaseAddress_local;
    local_a4 = (uint)MRI_local << 1;
    local_a8 = (uint)MRI_local << 1;
    local_b0 = _AddressSize_local + local_50->End;
    format<unsigned_int,unsigned_int,unsigned_long>
              (&local_a0,(llvm *)" 0x%*.*lx)",(char *)&local_a4,&local_a8,(uint *)&local_b0,
               (unsigned_long *)MRI);
    raw_ostream::operator<<((raw_ostream *)uVar1,&local_a0.super_format_object_base);
    raw_ostream::operator<<((raw_ostream *)BaseAddress_local,": ");
    uVar1 = BaseAddress_local;
    ArrayRef<unsigned_char>::ArrayRef<void>
              (&local_c0,(SmallVectorTemplateCommon<unsigned_char,_void> *)&local_50->Loc);
    MRI = (MCRegisterInfo *)__range1;
    dumpExpression((raw_ostream *)uVar1,local_c0,(bool)(MRI_local._7_1_ & 1),(uint)MRI_local,
                   (MCRegisterInfo *)__range1,U);
  }
  return;
}

Assistant:

void DWARFDebugLoc::LocationList::dump(raw_ostream &OS, uint64_t BaseAddress,
                                       bool IsLittleEndian,
                                       unsigned AddressSize,
                                       const MCRegisterInfo *MRI, DWARFUnit *U,
                                       DIDumpOptions DumpOpts,
                                       unsigned Indent) const {
  for (const Entry &E : Entries) {
    OS << '\n';
    OS.indent(Indent);
    OS << format("[0x%*.*" PRIx64 ", ", AddressSize * 2, AddressSize * 2,
                 BaseAddress + E.Begin);
    OS << format(" 0x%*.*" PRIx64 ")", AddressSize * 2, AddressSize * 2,
                 BaseAddress + E.End);
    OS << ": ";

    dumpExpression(OS, E.Loc, IsLittleEndian, AddressSize, MRI, U);
  }
}